

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QPluginParsedMetaData>::emplace<QPluginParsedMetaData_const&>
          (QGenericArrayOps<QPluginParsedMetaData> *this,qsizetype i,QPluginParsedMetaData *args)

{
  qsizetype *pqVar1;
  QPluginParsedMetaData **ppQVar2;
  Data *pDVar3;
  QPluginParsedMetaData *pQVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  qsizetype qVar7;
  long in_FS_OFFSET;
  bool bVar8;
  Inserter local_98;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QPluginParsedMetaData>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<QPluginParsedMetaData>).size == i) {
      qVar7 = QArrayDataPointer<QPluginParsedMetaData>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<QPluginParsedMetaData>);
      if (qVar7 == 0) goto LAB_002ad7c7;
      QCborValue::QCborValue
                ((QCborValue *)
                 ((this->super_QArrayDataPointer<QPluginParsedMetaData>).ptr +
                 (this->super_QArrayDataPointer<QPluginParsedMetaData>).size),&args->data);
LAB_002ad8f1:
      pqVar1 = &(this->super_QArrayDataPointer<QPluginParsedMetaData>).size;
      *pqVar1 = *pqVar1 + 1;
      goto LAB_002ad8b0;
    }
LAB_002ad7c7:
    if (i == 0) {
      qVar7 = QArrayDataPointer<QPluginParsedMetaData>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<QPluginParsedMetaData>);
      if (qVar7 != 0) {
        QCborValue::QCborValue
                  ((QCborValue *)((this->super_QArrayDataPointer<QPluginParsedMetaData>).ptr + -1),
                   &args->data);
        ppQVar2 = &(this->super_QArrayDataPointer<QPluginParsedMetaData>).ptr;
        *ppQVar2 = *ppQVar2 + -1;
        goto LAB_002ad8f1;
      }
    }
  }
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QCborValue::QCborValue((QCborValue *)local_48,&args->data);
  bVar8 = (this->super_QArrayDataPointer<QPluginParsedMetaData>).size != 0;
  QArrayDataPointer<QPluginParsedMetaData>::detachAndGrow
            (&this->super_QArrayDataPointer<QPluginParsedMetaData>,(uint)(i == 0 && bVar8),1,
             (QPluginParsedMetaData **)0x0,(QArrayDataPointer<QPluginParsedMetaData> *)0x0);
  uVar5 = local_48._8_8_;
  if (i == 0 && bVar8) {
    pQVar4 = (this->super_QArrayDataPointer<QPluginParsedMetaData>).ptr;
    pQVar4[-1].data.n = local_48._0_8_;
    local_48._8_8_ = (QCborContainerPrivate *)0x0;
    pQVar4[-1].data.container = (QCborContainerPrivate *)uVar5;
    uVar6 = local_48._16_4_;
    local_48._16_4_ = 0x117;
    pQVar4[-1].data.t = uVar6;
    (this->super_QArrayDataPointer<QPluginParsedMetaData>).ptr = pQVar4 + -1;
    pqVar1 = &(this->super_QArrayDataPointer<QPluginParsedMetaData>).size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    local_98.sourceCopyConstruct = 0;
    local_98.nSource = 0;
    local_98.move = 0;
    local_98.sourceCopyAssign = 0;
    local_98.end = (QPluginParsedMetaData *)0x0;
    local_98.last = (QPluginParsedMetaData *)0x0;
    local_98.where = (QPluginParsedMetaData *)0x0;
    local_98.begin = (this->super_QArrayDataPointer<QPluginParsedMetaData>).ptr;
    local_98.size = (this->super_QArrayDataPointer<QPluginParsedMetaData>).size;
    local_98.data = &this->super_QArrayDataPointer<QPluginParsedMetaData>;
    Inserter::insertOne(&local_98,i,(QPluginParsedMetaData *)local_48);
    (local_98.data)->ptr = local_98.begin;
    (local_98.data)->size = local_98.size;
  }
  QCborValue::~QCborValue((QCborValue *)local_48);
LAB_002ad8b0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }